

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.hpp
# Opt level: O2

void __thiscall
OpenMD::TorsionStamp::setMembers(TorsionStamp *this,tuple<int,_int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Tuple_impl<2UL,_int,_int> local_28;
  undefined8 uStack_20;
  
  local_28 = (tuple->super__Tuple_impl<0UL,_int,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
  uStack_20 = *(undefined8 *)
               &(tuple->super__Tuple_impl<0UL,_int,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>;
  this_00 = &this->members_;
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict *)((long)&uStack_20 + 4));
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict *)&uStack_20);
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,&local_28.super__Head_base<2UL,_int,_false>._M_head_impl);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict *)&local_28);
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int, int>& tuple) {
      auto [first, second, third, fourth] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
      members_.push_back(fourth);
    }